

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLin>::
operator()(ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLin>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  int iVar3;
  GetterXsYs<double> *pGVar4;
  GetterXsYs<double> *pGVar5;
  ImDrawVert *pIVar6;
  ImDrawIdx *pIVar7;
  ImVec2 IVar8;
  float fVar9;
  undefined1 auVar10 [12];
  int iVar11;
  long lVar12;
  ImDrawIdx IVar13;
  ushort uVar14;
  ImPlotContext *gp;
  long lVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  ImVec2 IVar24;
  double dVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar37 [16];
  
  pGVar4 = this->Getter1;
  pGVar5 = this->Getter2;
  iVar11 = pGVar4->Count;
  lVar15 = (long)(((pGVar4->Offset + prim + 1) % iVar11 + iVar11) % iVar11) * (long)pGVar4->Stride;
  iVar11 = this->Transformer->YAxis;
  iVar3 = pGVar5->Count;
  IVar24 = GImPlot->PixelRange[iVar11].Min;
  dVar23 = (double)IVar24.x;
  dVar25 = (double)IVar24.y;
  dVar1 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar11].Range.Min;
  lVar12 = (long)(((prim + 1 + pGVar5->Offset) % iVar3 + iVar3) % iVar3) * (long)pGVar5->Stride;
  fVar21 = (float)((*(double *)((long)pGVar4->Xs + lVar15) - dVar1) * GImPlot->Mx + dVar23);
  fVar22 = (float)((*(double *)((long)pGVar4->Ys + lVar15) - dVar2) * GImPlot->My[iVar11] + dVar25);
  IVar24.x = (float)((*(double *)((long)pGVar5->Xs + lVar12) - dVar1) * GImPlot->Mx + dVar23);
  IVar24.y = (float)((*(double *)((long)pGVar5->Ys + lVar12) - dVar2) * GImPlot->My[iVar11] + dVar25
                    );
  fVar9 = (this->P12).x;
  fVar26 = (this->P12).y;
  fVar28 = (this->P11).x;
  fVar29 = (this->P11).y;
  uVar19 = -(uint)(fVar29 < fVar26);
  fVar27 = (float)(~-(uint)(fVar9 <= fVar28) & (uint)fVar9 | (uint)fVar28 & -(uint)(fVar9 <= fVar28)
                  );
  fVar30 = (float)(~-(uint)(fVar26 <= fVar29) & (uint)fVar26 |
                  (uint)fVar29 & -(uint)(fVar26 <= fVar29));
  fVar33 = (float)(~-(uint)(fVar28 < fVar9) & (uint)fVar9 | (uint)fVar28 & -(uint)(fVar28 < fVar9));
  fVar41 = (float)(~uVar19 & (uint)fVar26 | (uint)fVar29 & uVar19);
  uVar16 = -(uint)(fVar21 <= fVar27);
  uVar17 = -(uint)(fVar22 <= fVar30);
  uVar18 = -(uint)(fVar33 < fVar21);
  uVar20 = -(uint)(fVar41 < fVar22);
  fVar27 = (float)(~uVar16 & (uint)fVar21 | (uint)fVar27 & uVar16);
  fVar30 = (float)(~uVar17 & (uint)fVar22 | (uint)fVar30 & uVar17);
  fVar33 = (float)(~uVar18 & (uint)fVar21 | (uint)fVar33 & uVar18);
  fVar41 = (float)(~uVar20 & (uint)fVar22 | (uint)fVar41 & uVar20);
  uVar16 = -(uint)(IVar24.x <= fVar27);
  uVar17 = -(uint)(IVar24.y <= fVar30);
  uVar18 = -(uint)(fVar33 < IVar24.x);
  uVar20 = -(uint)(fVar41 < IVar24.y);
  auVar32._0_4_ = (uint)fVar27 & uVar16;
  auVar32._4_4_ = (uint)fVar30 & uVar17;
  auVar32._8_4_ = (uint)fVar33 & uVar18;
  auVar32._12_4_ = (uint)fVar41 & uVar20;
  auVar38._0_4_ = ~uVar16 & (uint)IVar24.x;
  auVar38._4_4_ = ~uVar17 & (uint)IVar24.y;
  auVar38._8_4_ = ~uVar18 & (uint)IVar24.x;
  auVar38._12_4_ = ~uVar20 & (uint)IVar24.y;
  auVar38 = auVar38 | auVar32;
  fVar27 = (cull_rect->Min).y;
  auVar40._4_4_ = -(uint)(fVar27 < auVar38._4_4_);
  auVar40._0_4_ = -(uint)((cull_rect->Min).x < auVar38._0_4_);
  auVar10._4_8_ = auVar38._8_8_;
  auVar10._0_4_ = -(uint)(auVar38._4_4_ < fVar27);
  auVar39._0_8_ = auVar10._0_8_ << 0x20;
  auVar39._8_4_ = -(uint)(auVar38._8_4_ < (cull_rect->Max).x);
  auVar39._12_4_ = -(uint)(auVar38._12_4_ < (cull_rect->Max).y);
  auVar40._8_8_ = auVar39._8_8_;
  iVar11 = movmskps((int)lVar12,auVar40);
  if (iVar11 == 0xf) {
    fVar30 = fVar22 * fVar28 - fVar29 * fVar21;
    fVar33 = IVar24.y * fVar9 - fVar26 * IVar24.x;
    fVar27 = fVar26 - IVar24.y;
    auVar34._4_4_ = fVar27;
    auVar34._0_4_ = fVar27;
    auVar34._8_4_ = fVar27;
    auVar34._12_4_ = fVar27;
    auVar35._4_12_ = auVar34._4_12_;
    auVar35._0_4_ = fVar27 * (fVar28 - fVar21) - (fVar29 - fVar22) * (fVar9 - IVar24.x);
    auVar31._0_4_ = fVar30 * (fVar9 - IVar24.x) - fVar33 * (fVar28 - fVar21);
    auVar31._4_4_ = fVar30 * fVar27 - fVar33 * (fVar29 - fVar22);
    auVar31._8_4_ = fVar22 * 0.0 - IVar24.y * 0.0;
    auVar31._12_4_ = fVar22 * 0.0 - IVar24.y * 0.0;
    auVar37._0_8_ = auVar35._0_8_;
    auVar37._8_4_ = fVar27;
    auVar37._12_4_ = fVar27;
    auVar36._8_8_ = auVar37._8_8_;
    auVar36._4_4_ = auVar35._0_4_;
    auVar36._0_4_ = auVar35._0_4_;
    auVar32 = divps(auVar31,auVar36);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6->col = this->Col;
    IVar8.y = fVar22;
    IVar8.x = fVar21;
    pIVar6[1].pos = IVar8;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[1].col = this->Col;
    pIVar6[2].pos = auVar32._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[2].col = this->Col;
    pIVar6[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[3].col = this->Col;
    pIVar6[4].pos = IVar24;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar6 = DrawList->_VtxWritePtr;
    pIVar6[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar6 + 5;
    uVar16 = DrawList->_VtxCurrentIdx;
    pIVar7 = DrawList->_IdxWritePtr;
    IVar13 = (ImDrawIdx)uVar16;
    *pIVar7 = IVar13;
    uVar14 = (byte)((byte)uVar19 & IVar24.y < fVar22 | -(fVar26 < fVar29) & -(fVar22 < IVar24.y)) &
             1;
    pIVar7[1] = IVar13 + uVar14 + 1;
    pIVar7[2] = IVar13 + 3;
    pIVar7[3] = IVar13 + 1;
    pIVar7[4] = (uVar14 ^ 3) + IVar13;
    pIVar7[5] = IVar13 + 4;
    DrawList->_IdxWritePtr = pIVar7 + 6;
    DrawList->_VtxCurrentIdx = uVar16 + 5;
  }
  (this->P11).x = fVar21;
  (this->P11).y = fVar22;
  (this->P12).x = IVar24.x;
  (this->P12).y = IVar24.y;
  return (char)iVar11 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }